

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O3

int nuraft::buffer::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *(uint *)src;
  uVar4 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar4 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar3 = *(uint *)(src + 4);
  }
  else {
    uVar3 = uVar1 >> 0x10;
  }
  alloc((buffer *)dst,(ulong)(uVar4 & uVar1) - (ulong)uVar3);
  put(*(buffer **)dst,(buffer *)src);
  piVar2 = *(int **)dst;
  if (*piVar2 < 0) {
    piVar2[1] = 0;
  }
  else {
    *(undefined2 *)((long)piVar2 + 2) = 0;
  }
  return (int)dst;
}

Assistant:

ptr<buffer> buffer::copy(const buffer& buf) {
    ptr<buffer> other = alloc(buf.size() - buf.pos());
    other->put(buf);
    other->pos(0);
    return other;
}